

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blackboard.h
# Opt level: O0

TypedData * blackboard_get(Blackboard *b,int id)

{
  TypedData *pTVar1;
  bool bVar2;
  iterator __position;
  pointer ppVar3;
  long in_RDI;
  TypedData *r;
  iterator it;
  lock_guard<std::mutex> lock;
  map<int,_TypedData_*,_std::less<int>,_std::allocator<std::pair<const_int,_TypedData_*>_>_>
  *in_stack_ffffffffffffff88;
  map<int,_TypedData_*,_std::less<int>,_std::allocator<std::pair<const_int,_TypedData_*>_>_>
  *in_stack_ffffffffffffff90;
  _Self local_40 [3];
  _Self local_28 [4];
  TypedData *local_8;
  
  if (in_RDI == 0) {
    local_8 = (TypedData *)0x0;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff90,
               (mutex_type *)in_stack_ffffffffffffff88);
    __position = std::
                 map<int,_TypedData_*,_std::less<int>,_std::allocator<std::pair<const_int,_TypedData_*>_>_>
                 ::find(in_stack_ffffffffffffff88,(key_type *)0x117d35);
    local_28[0]._M_node = __position._M_node;
    local_40[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_TypedData_*,_std::less<int>,_std::allocator<std::pair<const_int,_TypedData_*>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar2 = std::operator==(local_28,local_40);
    if (bVar2) {
      local_8 = (TypedData *)0x0;
    }
    else {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_TypedData_*>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_TypedData_*>_> *)
                          in_stack_ffffffffffffff90);
      pTVar1 = ppVar3->second;
      std::map<int,TypedData*,std::less<int>,std::allocator<std::pair<int_const,TypedData*>>>::
      erase_abi_cxx11_(in_stack_ffffffffffffff90,__position);
      local_8 = pTVar1;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x117df8);
  }
  return local_8;
}

Assistant:

TypedData* blackboard_get(Blackboard* b, int id)
{
    if (!b)
        return 0;

    std::lock_guard<std::mutex> lock(b->bb_mutex);
    auto it = b->values.find(id);
    if (it == b->values.end())
        return {};

    auto r = it->second;
    b->values.erase(it);
    return r;
}